

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

bool bloaty::BloatyMain(Options *options,InputFileFactory *file_factory,RollupOutput *output,
                       string *error)

{
  Error *e;
  RollupOutput *in_stack_00000470;
  InputFileFactory *in_stack_00000478;
  Options *in_stack_00000480;
  
  BloatyDoMain(in_stack_00000480,in_stack_00000478,in_stack_00000470);
  return true;
}

Assistant:

bool BloatyMain(const Options& options, const InputFileFactory& file_factory,
                RollupOutput* output, std::string* error) {
  try {
    BloatyDoMain(options, file_factory, output);
    return true;
  } catch (const bloaty::Error& e) {
    error->assign(e.what());
    return false;
  }
}